

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O3

void png_chunk_warning(png_const_structrp png_ptr,png_const_charp warning_message)

{
  char msg [214];
  char acStack_e8 [216];
  
  if (png_ptr == (png_const_structrp)0x0) {
    png_chunk_warning_cold_1();
  }
  else {
    png_format_buffer((png_const_structrp)(ulong)png_ptr->chunk_name,acStack_e8,warning_message);
    png_warning(png_ptr,acStack_e8);
  }
  return;
}

Assistant:

void PNGAPI
png_chunk_warning(png_const_structrp png_ptr, png_const_charp warning_message)
{
   char msg[18+PNG_MAX_ERROR_TEXT];
   if (png_ptr == NULL)
      png_warning(png_ptr, warning_message);

   else
   {
      png_format_buffer(png_ptr, msg, warning_message);
      png_warning(png_ptr, msg);
   }
}